

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RadialTangentialDistortion::RadialTangentialDistortion
          (RadialTangentialDistortion *this,Properties *prop,int id)

{
  Distortion *in_RDI;
  int in_stack_000000b4;
  char *in_stack_000000b8;
  char *in_stack_00000168;
  double *in_stack_00000170;
  char *in_stack_00000178;
  Properties *in_stack_00000180;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  Distortion::Distortion(in_RDI);
  in_RDI->_vptr_Distortion = (_func_int **)&PTR__RadialTangentialDistortion_001f9a08;
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000b8,in_stack_000000b4);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000b8,in_stack_000000b4);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  std::__cxx11::string::~string(local_68);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000b8,in_stack_000000b4);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  std::__cxx11::string::~string(local_88);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000b8,in_stack_000000b4);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  std::__cxx11::string::~string(local_a8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000b8,in_stack_000000b4);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  std::__cxx11::string::~string(local_c8);
  *(undefined4 *)&in_RDI[1]._vptr_Distortion = 0;
  if (((double)in_RDI[6]._vptr_Distortion != 0.0) || (NAN((double)in_RDI[6]._vptr_Distortion))) {
    *(int *)&in_RDI[1]._vptr_Distortion = *(int *)&in_RDI[1]._vptr_Distortion + 1;
  }
  if ((((double)in_RDI[5]._vptr_Distortion != 0.0) || (NAN((double)in_RDI[5]._vptr_Distortion))) ||
     (0 < *(int *)&in_RDI[1]._vptr_Distortion)) {
    *(int *)&in_RDI[1]._vptr_Distortion = *(int *)&in_RDI[1]._vptr_Distortion + 1;
  }
  if ((((double)in_RDI[4]._vptr_Distortion != 0.0) || (NAN((double)in_RDI[4]._vptr_Distortion))) ||
     (0 < *(int *)&in_RDI[1]._vptr_Distortion)) {
    *(int *)&in_RDI[1]._vptr_Distortion = *(int *)&in_RDI[1]._vptr_Distortion + 1;
  }
  return;
}

Assistant:

RadialTangentialDistortion::RadialTangentialDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("p1", id).c_str(), kd[0], "0");
  prop.getValue(getCameraKey("p2", id).c_str(), kd[1], "0");

  prop.getValue(getCameraKey("k1", id).c_str(), kd[2], "0");
  prop.getValue(getCameraKey("k2", id).c_str(), kd[3], "0");
  prop.getValue(getCameraKey("k3", id).c_str(), kd[4], "0");

  kn=0;

  if (kd[4] != 0)
  {
    kn++;
  }

  if (kd[3] != 0 || kn > 0)
  {
    kn++;
  }

  if (kd[2] != 0 || kn > 0)
  {
    kn++;
  }
}